

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O3

void __thiscall
s2polyline_alignment::Window::Window
          (Window *this,
          vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          *strides)

{
  pointer pCVar1;
  bool bVar2;
  S2LogMessage SStack_28;
  
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->strides_).
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (strides->
           super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 == (strides->
                super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x22,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: !strides.empty() ",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Cannot construct empty window.",0x1e);
  }
  else if (pCVar1->start == 0) {
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::operator=(&this->strides_,strides);
    pCVar1 = (strides->
             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    this->rows_ = (int)((ulong)((long)pCVar1 -
                               (long)(strides->
                                     super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
    this->cols_ = pCVar1[-1].end;
    bVar2 = IsValid(this);
    if (bVar2) {
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x27,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: this->IsValid() ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Constructor validity check fail.",0x20);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x23,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"Check failed: strides[0].start == 0 ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_28.stream_,"First element of start_cols is non-zero.",0x28);
  }
  abort();
}

Assistant:

Window::Window(const std::vector<ColumnStride>& strides) {
  S2_DCHECK(!strides.empty()) << "Cannot construct empty window.";
  S2_DCHECK(strides[0].start == 0) << "First element of start_cols is non-zero.";
  strides_ = strides;
  rows_ = strides.size();
  cols_ = strides.back().end;
  S2_DCHECK(this->IsValid()) << "Constructor validity check fail.";
}